

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O0

void __thiscall
pbrt::FormattingScene::Sampler
          (FormattingScene *this,string *name,ParsedParameterVector *params,FileLoc loc)

{
  undefined1 uVar1;
  bool bVar2;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDX;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDI;
  ParameterDictionary dict;
  char *in_stack_fffffffffffffe48;
  undefined5 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe55;
  undefined1 in_stack_fffffffffffffe56;
  undefined1 in_stack_fffffffffffffe57;
  undefined4 in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe74;
  FormattingScene *in_stack_fffffffffffffe78;
  ParameterDictionary *in_stack_fffffffffffffe80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe88;
  char *in_stack_fffffffffffffe90;
  string local_150 [20];
  int in_stack_fffffffffffffec4;
  ParameterDictionary *in_stack_fffffffffffffec8;
  string local_130 [32];
  string local_110 [272];
  
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(in_RDI,in_RDX);
  ParameterDictionary::ParameterDictionary
            (in_stack_fffffffffffffe80,(ParsedParameterVector *)in_stack_fffffffffffffe78,
             (RGBColorSpace *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector((InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                    *)CONCAT17(in_stack_fffffffffffffe57,
                               CONCAT16(in_stack_fffffffffffffe56,
                                        CONCAT15(in_stack_fffffffffffffe55,in_stack_fffffffffffffe50
                                                ))));
  if ((undefined1  [64])((undefined1  [64])in_RDI->field_2 & (undefined1  [64])0x100) ==
      (undefined1  [64])0x0) {
    indent_abi_cxx11_(in_stack_fffffffffffffe78,in_stack_fffffffffffffe74);
    Printf<std::__cxx11::string,std::__cxx11::string_const&>
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe80);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe90);
  }
  else {
    uVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffffe57,
                                     CONCAT16(in_stack_fffffffffffffe56,
                                              CONCAT15(in_stack_fffffffffffffe55,
                                                       in_stack_fffffffffffffe50))),
                            in_stack_fffffffffffffe48);
    if (((bool)uVar1) ||
       (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffe56,
                                                         CONCAT15(in_stack_fffffffffffffe55,
                                                                  in_stack_fffffffffffffe50))),
                                in_stack_fffffffffffffe48), bVar2)) {
      indent_abi_cxx11_(in_stack_fffffffffffffe78,in_stack_fffffffffffffe74);
      Printf<std::__cxx11::string>
                ((char *)in_stack_fffffffffffffe80,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe78);
      std::__cxx11::string::~string(local_110);
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(uVar1,CONCAT16(bVar2,CONCAT15(in_stack_fffffffffffffe55,
                                                                     in_stack_fffffffffffffe50))),
                              in_stack_fffffffffffffe48);
      if (bVar2) {
        indent_abi_cxx11_(in_stack_fffffffffffffe78,in_stack_fffffffffffffe74);
        Printf<std::__cxx11::string>
                  ((char *)in_stack_fffffffffffffe80,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe78);
        std::__cxx11::string::~string(local_130);
      }
      else {
        indent_abi_cxx11_(in_stack_fffffffffffffe78,in_stack_fffffffffffffe74);
        Printf<std::__cxx11::string,std::__cxx11::string_const&>
                  (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe80);
        std::__cxx11::string::~string(local_150);
      }
    }
  }
  ParameterDictionary::ToParameterList_abi_cxx11_
            (in_stack_fffffffffffffec8,in_stack_fffffffffffffec4);
  std::operator<<((ostream *)&std::cout,(string *)&stack0xfffffffffffffe70);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe70);
  ParameterDictionary::~ParameterDictionary((ParameterDictionary *)0x9d3f4c);
  return;
}

Assistant:

void FormattingScene::Sampler(const std::string &name, ParsedParameterVector params,
                              FileLoc loc) {
    ParameterDictionary dict(std::move(params), RGBColorSpace::sRGB);

    if (upgrade) {
        if (name == "lowdiscrepancy" || name == "02sequence")
            Printf("%sSampler \"paddedsobol\"\n", indent());
        else if (name == "maxmindist")
            Printf("%sSampler \"pmj02bn\"\n", indent());
        else
            Printf("%sSampler \"%s\"\n", indent(), name);
    } else
        Printf("%sSampler \"%s\"\n", indent(), name);
    std::cout << dict.ToParameterList(catIndentCount);
}